

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AppendFortranFormatFlags
          (cmCommonTargetGenerator *this,string *flags,cmSourceFile *source)

{
  cmGeneratorTarget *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *pcVar1;
  char *__s;
  string *psVar2;
  string_view value;
  string_view value_00;
  undefined1 auVar3 [16];
  allocator<char> local_f1;
  string local_f0;
  char *local_d0;
  char *var;
  char *local_c0;
  allocator<char> local_b1;
  string local_b0;
  string *local_90;
  string *tgtfmt;
  char *local_80;
  FortranFormat local_78;
  FortranFormat format;
  allocator<char> local_61;
  string local_60;
  string local_40 [8];
  string srcfmt;
  cmSourceFile *source_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  srcfmt.field_2._8_8_ = source;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"Fortran_FORMAT",&local_61)
  ;
  psVar2 = cmSourceFile::GetSafeProperty(source,&local_60);
  std::__cxx11::string::string(local_40,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view(local_40);
  value._M_str = auVar3._8_8_;
  tgtfmt = auVar3._0_8_;
  value._M_len = (size_t)value._M_str;
  local_80 = value._M_str;
  local_78 = cmOutputConverter::GetFortranFormat((cmOutputConverter *)tgtfmt,value);
  if (local_78 == FortranFormatNone) {
    this_00 = this->GeneratorTarget;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"Fortran_FORMAT",&local_b1);
    psVar2 = cmGeneratorTarget::GetSafeProperty(this_00,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    local_90 = psVar2;
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar2);
    value_00._M_str = auVar3._8_8_;
    var = auVar3._0_8_;
    value_00._M_len = (size_t)value_00._M_str;
    local_c0 = value_00._M_str;
    local_78 = cmOutputConverter::GetFortranFormat((cmOutputConverter *)var,value_00);
  }
  local_d0 = (char *)0x0;
  if (local_78 == FortranFormatFixed) {
    local_d0 = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
  }
  else if (local_78 == FortranFormatFree) {
    local_d0 = "CMAKE_Fortran_FORMAT_FREE_FLAG";
  }
  __s = local_d0;
  if (local_d0 != (char *)0x0) {
    this_01 = this->Makefile;
    pcVar1 = this->LocalCommonGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,__s,&local_f1);
    psVar2 = cmMakefile::GetSafeDefinition(this_01,&local_f0);
    (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,flags,psVar2);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendFortranFormatFlags(
  std::string& flags, cmSourceFile const& source)
{
  const std::string srcfmt = source.GetSafeProperty("Fortran_FORMAT");
  cmOutputConverter::FortranFormat format =
    cmOutputConverter::GetFortranFormat(srcfmt);
  if (format == cmOutputConverter::FortranFormatNone) {
    std::string const& tgtfmt =
      this->GeneratorTarget->GetSafeProperty("Fortran_FORMAT");
    format = cmOutputConverter::GetFortranFormat(tgtfmt);
  }
  const char* var = nullptr;
  switch (format) {
    case cmOutputConverter::FortranFormatFixed:
      var = "CMAKE_Fortran_FORMAT_FIXED_FLAG";
      break;
    case cmOutputConverter::FortranFormatFree:
      var = "CMAKE_Fortran_FORMAT_FREE_FLAG";
      break;
    default:
      break;
  }
  if (var) {
    this->LocalCommonGenerator->AppendFlags(
      flags, this->Makefile->GetSafeDefinition(var));
  }
}